

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

void pythonIgnorableWhitespace(void *user_data,xmlChar *ch,int len)

{
  int iVar1;
  PyObject *op;
  char *pcVar2;
  
  pcVar2 = "ignorableWhitespace";
  iVar1 = PyObject_HasAttrString(user_data,"ignorableWhitespace");
  if (iVar1 == 0) {
    pcVar2 = "data";
    iVar1 = PyObject_HasAttrString(user_data,"data");
    if (iVar1 == 0) {
      return;
    }
  }
  op = (PyObject *)_PyObject_CallMethod_SizeT(user_data,pcVar2,"s#",ch,(long)len);
  _Py_XDECREF(op);
  return;
}

Assistant:

static void
pythonIgnorableWhitespace(void *user_data, const xmlChar * ch, int len)
{
    PyObject *handler;
    PyObject *result = NULL;
    int type = 0;

    handler = (PyObject *) user_data;
    if (PyObject_HasAttrString(handler, (char *) "ignorableWhitespace"))
        type = 1;
    else if (PyObject_HasAttrString(handler, (char *) "data"))
        type = 2;
    if (type != 0) {
        if (type == 1)
            result =
                PyObject_CallMethod(handler,
                                    (char *) "ignorableWhitespace",
                                    (char *) "s#", ch, (Py_ssize_t)len);
        else if (type == 2)
            result =
                PyObject_CallMethod(handler, (char *) "data",
                                    (char *) "s#", ch, (Py_ssize_t)len);
        Py_XDECREF(result);
    }
}